

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

CharClassBuilder * __thiscall duckdb_re2::CharClassBuilder::Copy(CharClassBuilder *this)

{
  bool bVar1;
  CharClassBuilder *pCVar2;
  pointer pRVar3;
  uint32_t *in_RDI;
  pair<std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>,_bool> pVar4;
  iterator it;
  CharClassBuilder *cc;
  undefined4 in_stack_ffffffffffffff98;
  Rune in_stack_ffffffffffffff9c;
  CharClassBuilder *in_stack_ffffffffffffffa0;
  RuneRangeSet *this_00;
  _Rb_tree_const_iterator<duckdb_re2::RuneRange> in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  RuneRange local_38;
  _Self local_30;
  _Self local_28 [3];
  CharClassBuilder *local_10;
  
  pCVar2 = (CharClassBuilder *)operator_new(0x40);
  CharClassBuilder(in_stack_ffffffffffffffa0);
  local_10 = pCVar2;
  local_28[0]._M_node =
       (_Base_ptr)
       begin((CharClassBuilder *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         end((CharClassBuilder *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar1 = std::operator!=(local_28,&local_30);
    if (!bVar1) break;
    this_00 = &local_10->ranges_;
    pRVar3 = std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator->
                       ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)0x2600674);
    in_stack_ffffffffffffff9c = pRVar3->lo;
    pRVar3 = std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator->
                       ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)0x2600684);
    RuneRange::RuneRange(&local_38,in_stack_ffffffffffffff9c,pRVar3->hi);
    pVar4 = std::
            set<duckdb_re2::RuneRange,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
            ::insert((set<duckdb_re2::RuneRange,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
                      *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
                     (value_type *)in_stack_ffffffffffffffb8._M_node);
    in_stack_ffffffffffffffb8 = pVar4.first._M_node;
    in_stack_ffffffffffffffc0 = pVar4.second;
    std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator++
              ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)this_00);
  }
  local_10->upper_ = *in_RDI;
  local_10->lower_ = in_RDI[1];
  local_10->nrunes_ = in_RDI[2];
  return local_10;
}

Assistant:

CharClassBuilder* CharClassBuilder::Copy() {
  CharClassBuilder* cc = new CharClassBuilder;
  for (iterator it = begin(); it != end(); ++it)
    cc->ranges_.insert(RuneRange(it->lo, it->hi));
  cc->upper_ = upper_;
  cc->lower_ = lower_;
  cc->nrunes_ = nrunes_;
  return cc;
}